

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

ggml_status ggml_backend_sched_compute_splits(ggml_backend_sched_t sched)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int64_t iVar5;
  ggml_status gVar6;
  int *piVar7;
  ggml_backend_t pgVar8;
  size_t sVar9;
  ulong uVar10;
  long in_RDI;
  ggml_status ec_1;
  ggml_cgraph gv;
  int j1;
  _Bool need;
  ggml_tensor *t;
  int j0;
  ggml_status ec;
  ggml_tensor *input_cpy;
  ggml_tensor *input;
  ggml_backend_t input_backend;
  int j;
  ggml_backend_t split_backend;
  int split_backend_id;
  ggml_backend_sched_split *split;
  int i;
  ggml_backend_sched_split *splits;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  ggml_tensor *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  ggml_status in_stack_ffffffffffffff3c;
  ggml_cgraph *in_stack_ffffffffffffff40;
  ggml_tensor *in_stack_ffffffffffffff58;
  ggml_tensor *in_stack_ffffffffffffff60;
  int local_70;
  byte local_69;
  undefined8 local_68;
  int local_60;
  int local_3c;
  int local_1c;
  
  lVar2 = *(long *)(in_RDI + 0x1a8);
  local_1c = 0;
  do {
    if (*(int *)(in_RDI + 0x1b0) <= local_1c) {
      *(int *)(in_RDI + 0x1bc) = (*(int *)(in_RDI + 0x1bc) + 1) % *(int *)(in_RDI + 0x1b8);
      return GGML_STATUS_SUCCESS;
    }
    piVar7 = (int *)(lVar2 + (long)local_1c * 0xb8);
    iVar1 = *piVar7;
    lVar3 = *(long *)(in_RDI + 8 + (long)iVar1 * 8);
    for (local_3c = 0; local_3c < piVar7[0x18]; local_3c = local_3c + 1) {
      pgVar8 = ggml_backend_sched_get_tensor_backend
                         ((ggml_backend_sched_t)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          in_stack_ffffffffffffff30);
      lVar4 = *(long *)(piVar7 + (long)local_3c * 2 + 4);
      in_stack_ffffffffffffff30 = *(ggml_tensor **)(in_RDI + 0x130);
      sVar9 = ggml_hash_find_or_insert
                        ((ggml_hash_set *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         in_stack_ffffffffffffff30);
      iVar5 = in_stack_ffffffffffffff30->ne
              [sVar9 * (long)*(int *)(in_RDI + 4) * (long)*(int *)(in_RDI + 0x1b8) +
               (long)(iVar1 * *(int *)(in_RDI + 0x1b8)) + (long)*(int *)(in_RDI + 0x1bc) + -2];
      if ((*(uint *)(lVar4 + 0x94) & 1) == 0) {
        if (*(long *)(in_RDI + 0x1c0 + (long)iVar1 * 0x20 + (long)*(int *)(in_RDI + 0x1bc) * 8) == 0
           ) {
          ggml_backend_synchronize((ggml_backend_t)0x1624f5);
        }
        else {
          ggml_backend_event_wait
                    ((ggml_backend_t)in_stack_ffffffffffffff30,
                     (ggml_backend_event_t)
                     CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        }
        if ((*(long *)(lVar3 + 0x28) == 0) ||
           (uVar10 = (**(code **)(lVar3 + 0x28))(pgVar8,lVar3,lVar4,iVar5), (uVar10 & 1) == 0)) {
          ggml_backend_synchronize((ggml_backend_t)0x162547);
          if (*(long *)(in_RDI + 0x1c0 + (long)iVar1 * 0x20 + (long)*(int *)(in_RDI + 0x1bc) * 8) ==
              0) {
            ggml_backend_synchronize((ggml_backend_t)0x1625be);
          }
          else {
            ggml_backend_event_synchronize((ggml_backend_event_t)0x1625af);
          }
          ggml_backend_tensor_copy(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
      }
      else {
        if (*(long *)(in_RDI + 0x1c0 + (long)iVar1 * 0x20 + (long)*(int *)(in_RDI + 0x1bc) * 8) == 0
           ) {
          ggml_backend_synchronize((ggml_backend_t)0x16245c);
        }
        else {
          ggml_backend_event_synchronize((ggml_backend_event_t)0x16244d);
        }
        ggml_backend_tensor_copy(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    if (*(long *)(in_RDI + 0x420) == 0) {
      gVar6 = ggml_backend_graph_compute_async
                        ((ggml_backend_t)in_stack_ffffffffffffff30,
                         (ggml_cgraph *)
                         CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      if (gVar6 != GGML_STATUS_SUCCESS) {
        return gVar6;
      }
    }
    else {
      local_60 = 0;
      while (local_60 < piVar7[0x1b]) {
        local_68 = *(undefined8 *)(*(long *)(piVar7 + 0x1e) + (long)local_60 * 8);
        local_69 = (**(code **)(in_RDI + 0x420))(local_68,1,*(undefined8 *)(in_RDI + 0x428));
        local_70 = local_60;
        while( true ) {
          local_69 = local_69 & 1;
          in_stack_ffffffffffffff2f = false;
          if (local_69 == 0) {
            in_stack_ffffffffffffff2f = local_70 < piVar7[0x1b] + -1;
          }
          if ((bool)in_stack_ffffffffffffff2f == false) break;
          local_70 = local_70 + 1;
          local_68 = *(undefined8 *)(*(long *)(piVar7 + 0x1e) + (long)local_70 * 8);
          local_69 = (**(code **)(in_RDI + 0x420))(local_68,1,*(undefined8 *)(in_RDI + 0x428));
        }
        ggml_graph_view(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                        in_stack_ffffffffffffff38);
        in_stack_ffffffffffffff3c =
             ggml_backend_graph_compute_async
                       ((ggml_backend_t)in_stack_ffffffffffffff30,
                        (ggml_cgraph *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)
                       );
        if (in_stack_ffffffffffffff3c != GGML_STATUS_SUCCESS) {
          return in_stack_ffffffffffffff3c;
        }
        ggml_backend_synchronize((ggml_backend_t)0x16278c);
        if ((local_69 != 0) &&
           (uVar10 = (**(code **)(in_RDI + 0x420))(local_68,0,*(undefined8 *)(in_RDI + 0x428)),
           (uVar10 & 1) == 0)) break;
        local_60 = local_70 + 1;
      }
    }
    if ((0 < piVar7[0x18]) &&
       (*(long *)(in_RDI + 0x1c0 + (long)iVar1 * 0x20 + (long)*(int *)(in_RDI + 0x1bc) * 8) != 0)) {
      ggml_backend_event_record
                ((ggml_backend_event_t)in_stack_ffffffffffffff30,
                 (ggml_backend_t)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static enum ggml_status ggml_backend_sched_compute_splits(ggml_backend_sched_t sched) {
    struct ggml_backend_sched_split * splits = sched->splits;

    for (int i = 0; i < sched->n_splits; i++) {
        struct ggml_backend_sched_split * split = &splits[i];
        int split_backend_id = split->backend_id;
        ggml_backend_t split_backend = sched->backends[split_backend_id];

        // copy the input tensors to the split backend
        for (int j = 0; j < split->n_inputs; j++) {
            ggml_backend_t input_backend = ggml_backend_sched_get_tensor_backend(sched, split->inputs[j]);
            struct ggml_tensor * input = split->inputs[j];
            struct ggml_tensor * input_cpy = tensor_copy(input, split_backend_id, sched->cur_copy);

            if (input->flags & GGML_TENSOR_FLAG_INPUT) {
                // inputs from the user must be copied immediately to prevent the user overwriting the data before the copy is done
                if (sched->events[split_backend_id][sched->cur_copy] != NULL) {
                    ggml_backend_event_synchronize(sched->events[split_backend_id][sched->cur_copy]);
                } else {
                    ggml_backend_synchronize(split_backend);
                }
                ggml_backend_tensor_copy(input, input_cpy);
            } else {
                // wait for the split backend to finish using the input before overwriting it
                if (sched->events[split_backend_id][sched->cur_copy] != NULL) {
                    ggml_backend_event_wait(split_backend, sched->events[split_backend_id][sched->cur_copy]);
                } else {
                    ggml_backend_synchronize(split_backend);
                }
                // try async copy, but if not possible, we can still use a sync copy without synchronizing the dst backend, since we handle the synchronization here with multiple copies and events
                // TODO: add public function to facilitate this, since applications do not have direct access to the backend interface
                if (!split_backend->iface.cpy_tensor_async || !split_backend->iface.cpy_tensor_async(input_backend, split_backend, input, input_cpy)) {
                    ggml_backend_synchronize(input_backend);
                    if (sched->events[split_backend_id][sched->cur_copy] != NULL) {
                        ggml_backend_event_synchronize(sched->events[split_backend_id][sched->cur_copy]);
                    } else {
                        ggml_backend_synchronize(split_backend);
                    }
                    ggml_backend_tensor_copy(input, input_cpy);
                }
            }
        }

        if (!sched->callback_eval) {
            enum ggml_status ec = ggml_backend_graph_compute_async(split_backend, &split->graph);
            if (ec != GGML_STATUS_SUCCESS) {
                return ec;
            }
        } else {
            // similar to ggml_backend_compare_graph_backend
            for (int j0 = 0; j0 < split->graph.n_nodes; j0++) {
                struct ggml_tensor * t = split->graph.nodes[j0];

                // check if the user needs data from this node
                bool need = sched->callback_eval(t, true, sched->callback_eval_user_data);

                int j1 = j0;

                // determine the range [j0, j1] of nodes that can be computed together
                while (!need && j1 < split->graph.n_nodes - 1) {
                    t = split->graph.nodes[++j1];
                    need = sched->callback_eval(t, true, sched->callback_eval_user_data);
                }

                struct ggml_cgraph gv = ggml_graph_view(&split->graph, j0, j1 + 1);

                enum ggml_status ec = ggml_backend_graph_compute_async(split_backend, &gv);
                if (ec != GGML_STATUS_SUCCESS) {
                    return ec;
                }

                // TODO: pass backend to the callback, then the user can decide if they want to synchronize
                ggml_backend_synchronize(split_backend);

                if (need && !sched->callback_eval(t, false, sched->callback_eval_user_data)) {
                    break;
                }

                j0 = j1;
            }
        }

        // record the event of this copy
        if (split->n_inputs > 0) {
            if (sched->events[split_backend_id][sched->cur_copy] != NULL) {
                ggml_backend_event_record(sched->events[split_backend_id][sched->cur_copy], split_backend);
            }
        }
    }

    sched->cur_copy = (sched->cur_copy + 1) % sched->n_copies;

    return GGML_STATUS_SUCCESS;
}